

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

bool QFontDatabase::bold(QString *family,QString *style)

{
  QtFontFoundry *pQVar1;
  int iVar2;
  Type *pTVar3;
  QtFontFamily *pQVar4;
  QtFontStyle *pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QDeadlineTimer QVar9;
  QtFontFoundry local_a0;
  QString local_78;
  QString local_58;
  Key local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  parseFontName(family,&local_78,&local_58);
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)family);
  if (pTVar3 != (Type *)0x0) {
    QVar9.t2 = 0xffffffff;
    QVar9.type = 0x7fffffff;
    QVar9.t1 = (qint64)pTVar3;
    QRecursiveMutex::tryLock(QVar9);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  local_a0.name.d.d = local_78.d.d;
  local_a0.name.d.ptr = local_78.d.ptr;
  local_a0.name.d.size = local_78.d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0.count = 0;
  local_a0._28_4_ = 0xaaaaaaaa;
  local_a0.styles = (QtFontStyle **)0x0;
  pQVar4 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
  if (pQVar4 == (QtFontFamily *)0x0) {
    bVar8 = false;
  }
  else {
    if (0 < pQVar4->count) {
      lVar6 = 0;
      do {
        pQVar1 = pQVar4->foundries[lVar6];
        if (((local_78.d.size == 0) ||
            (iVar2 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_78), iVar2 == 0)) &&
           (0 < pQVar1->count)) {
          lVar7 = 0;
          do {
            QtFontFoundry::style
                      (&local_a0,&pQVar1->styles[lVar7]->key,&pQVar1->styles[lVar7]->styleName,true)
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 < pQVar1->count);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pQVar4->count);
    }
    local_3c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(&local_3c,style);
    bVar8 = false;
    pQVar5 = QtFontFoundry::style(&local_a0,&local_3c,style,false);
    if (pQVar5 != (QtFontStyle *)0x0) {
      bVar8 = 0xaec < (*(ushort *)&pQVar5->key & 0xff0);
    }
  }
  QtFontFoundry::~QtFontFoundry(&local_a0);
  if (pTVar3 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QFontDatabase::bold(const QString &family,
                          const QString &style)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFoundry allStyles(foundryName);
    QtFontFamily *f = d->family(familyName);
    if (!f) return false;

    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() ||
            foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                allStyles.style(foundry->styles[k]->key, foundry->styles[k]->styleName, true);
        }
    }

    QtFontStyle::Key styleKey(style);
    QtFontStyle *s = allStyles.style(styleKey, style);
    return s && s->key.weight >= QFont::Bold;
}